

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseTools.cpp
# Opt level: O1

string * __thiscall
tonk::HexString_abi_cxx11_(string *__return_storage_ptr__,tonk *this,uint64_t value)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  char *__s;
  char hex [17];
  char acStack_28 [14];
  char local_1a [10];
  
  pcVar3 = local_1a;
  local_1a[2] = 0;
  iVar1 = 8;
  do {
    pcVar3[1] = "0123456789abcdef"[(uint)this & 0xf];
    *pcVar3 = "0123456789abcdef"[(uint)this >> 4 & 0xf];
    __s = pcVar3;
    if (this < (tonk *)0x100) break;
    this = (tonk *)((ulong)this >> 8);
    pcVar3 = pcVar3 + -2;
    iVar1 = iVar1 + -1;
    __s = acStack_28;
  } while (iVar1 != 0);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar2 = strlen(__s);
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,__s,__s + sVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string HexString(uint64_t value)
{
    static const char* H = "0123456789abcdef";

    char hex[16 + 1];
    hex[16] = '\0';

    char* hexWrite = &hex[14];
    for (unsigned i = 0; i < 8; ++i)
    {
        hexWrite[1] = H[value & 15];
        hexWrite[0] = H[(value >> 4) & 15];

        value >>= 8;
        if (value == 0)
            return hexWrite;
        hexWrite -= 2;
    }

    return hex;
}